

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkTopAnd(Abc_Ntk_t *pNtk)

{
  Abc_Aig_t *pMan;
  uint uVar1;
  Abc_Obj_t *pAVar2;
  Vec_Ptr_t *vRoots;
  Abc_Ntk_t *pNtk_00;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  Vec_Ptr_t *p;
  Abc_Obj_t *p1;
  void *pvVar5;
  int iVar6;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcStrash.c"
                  ,0x29a,"Abc_Ntk_t *Abc_NtkTopAnd(Abc_Ntk_t *)");
  }
  iVar6 = 0;
  pAVar2 = Abc_NtkPo(pNtk,0);
  pAVar2 = Abc_ObjChild0(pAVar2);
  vRoots = Abc_NodeGetSuper(pAVar2);
  if (1 < vRoots->nSize) {
    Abc_NtkCleanCopy(pNtk);
    pNtk_00 = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
    pcVar3 = Extra_UtilStrsav(pNtk->pName);
    pNtk_00->pName = pcVar3;
    pcVar3 = Extra_UtilStrsav(pNtk->pSpec);
    pNtk_00->pSpec = pcVar3;
    pAVar2 = Abc_AigConst1(pNtk_00);
    pAVar4 = Abc_AigConst1(pNtk);
    (pAVar4->field_6).pCopy = pAVar2;
    for (; iVar6 < pNtk->vPis->nSize; iVar6 = iVar6 + 1) {
      pAVar2 = Abc_NtkPi(pNtk,iVar6);
      Abc_NtkDupObj(pNtk_00,pAVar2,1);
    }
    p = Abc_NtkDfsIterNodes(pNtk,vRoots);
    for (iVar6 = 0; iVar6 < p->nSize; iVar6 = iVar6 + 1) {
      pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p,iVar6);
      pMan = (Abc_Aig_t *)pNtk_00->pManFunc;
      pAVar4 = Abc_ObjChild0Copy(pAVar2);
      p1 = Abc_ObjChild1Copy(pAVar2);
      pAVar4 = Abc_AigAnd(pMan,pAVar4,p1);
      (pAVar2->field_6).pCopy = pAVar4;
    }
    Vec_PtrFree(p);
    for (iVar6 = 0; iVar6 < vRoots->nSize; iVar6 = iVar6 + 1) {
      pvVar5 = Vec_PtrEntry(vRoots,iVar6);
      pAVar2 = Abc_NtkCreatePo(pNtk_00);
      Abc_ObjAddFanin(pAVar2,(Abc_Obj_t *)
                             ((ulong)((uint)pvVar5 & 1) ^
                             *(ulong *)(((ulong)pvVar5 & 0xfffffffffffffffe) + 0x40)));
      pcVar3 = Abc_ObjName(pAVar2);
      Abc_ObjAssignName(pAVar2,pcVar3,(char *)0x0);
    }
    Vec_PtrFree(vRoots);
    uVar1 = Abc_AigCleanup((Abc_Aig_t *)pNtk_00->pManFunc);
    if (uVar1 != 0) {
      printf("Abc_NtkTopAnd(): AIG cleanup removed %d nodes (this is a bug).\n",(ulong)uVar1);
    }
    iVar6 = Abc_NtkCheck(pNtk_00);
    if (iVar6 == 0) {
      puts("Abc_NtkStrash: The network check has failed.");
      Abc_NtkDelete(pNtk_00);
      pNtk_00 = (Abc_Ntk_t *)0x0;
    }
    return pNtk_00;
  }
  __assert_fail("Vec_PtrSize(vNodes) >= 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcStrash.c"
                ,0x29e,"Abc_Ntk_t *Abc_NtkTopAnd(Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkTopAnd( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes, * vOrder;
    Abc_Ntk_t * pNtkAig;
    Abc_Obj_t * pObj, * pDriver, * pObjPo;
    int i, nNodes;
    assert( Abc_NtkIsStrash(pNtk) );
    // get the first PO
    pObjPo = Abc_NtkPo(pNtk, 0);
    vNodes = Abc_NodeGetSuper( Abc_ObjChild0(pObjPo) );
    assert( Vec_PtrSize(vNodes) >= 2 );
    // start the new network (constants and CIs of the old network will point to the their counterparts in the new network)
    Abc_NtkCleanCopy( pNtk );
    pNtkAig = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pNtkAig->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkAig->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkAig);
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkAig, pObj, 1 );
    // restrash the nodes reachable from the roots
    vOrder = Abc_NtkDfsIterNodes( pNtk, vNodes );
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pObj, i )
        pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkAig->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
    Vec_PtrFree( vOrder );
    // finalize the network
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        pObjPo = Abc_NtkCreatePo(pNtkAig);
        pDriver = Abc_ObjNotCond(Abc_ObjRegular(pObj)->pCopy, Abc_ObjIsComplement(pObj));
        Abc_ObjAddFanin( pObjPo, pDriver );
        Abc_ObjAssignName( pObjPo, Abc_ObjName(pObjPo), NULL );
    }
    Vec_PtrFree( vNodes );
    // perform cleanup if requested
    if ( (nNodes = Abc_AigCleanup((Abc_Aig_t *)pNtkAig->pManFunc)) ) 
        printf( "Abc_NtkTopAnd(): AIG cleanup removed %d nodes (this is a bug).\n", nNodes );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkAig ) )
    {
        printf( "Abc_NtkStrash: The network check has failed.\n" );
        Abc_NtkDelete( pNtkAig );
        return NULL;
    }
    return pNtkAig;
}